

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

JavascriptAsyncGeneratorFunction * __thiscall
Js::JavascriptLibrary::CreateAsyncGeneratorFunction
          (JavascriptLibrary *this,JavascriptMethod entryPoint,
          GeneratorVirtualScriptFunction *scriptFunction)

{
  code *pcVar1;
  GeneratorVirtualScriptFunction *entrypoint;
  bool bVar2;
  byte bVar3;
  ScriptContext *this_00;
  ScriptConfiguration *this_01;
  undefined4 *puVar4;
  Recycler *pRVar5;
  JavascriptAsyncGeneratorFunction *this_02;
  InfoBitsWrapper<(Memory::ObjectInfoBits)1> local_51;
  TrackAllocData local_50;
  DynamicType *local_28;
  DynamicType *type;
  GeneratorVirtualScriptFunction *scriptFunction_local;
  JavascriptMethod entryPoint_local;
  JavascriptLibrary *this_local;
  
  type = (DynamicType *)scriptFunction;
  scriptFunction_local = (GeneratorVirtualScriptFunction *)entryPoint;
  entryPoint_local = (JavascriptMethod)this;
  this_00 = Memory::WriteBarrierPtr<Js::ScriptContext>::operator->
                      (&(this->super_JavascriptLibraryBase).scriptContext);
  this_01 = ScriptContext::GetConfig(this_00);
  bVar2 = ScriptConfiguration::IsES2018AsyncIterationEnabled(this_01);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                                ,0x199b,
                                "(scriptContext->GetConfig()->IsES2018AsyncIterationEnabled())",
                                "scriptContext->GetConfig()->IsES2018AsyncIterationEnabled()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  entrypoint = scriptFunction_local;
  bVar3 = (**(code **)(*(long *)&type->super_Type + 0x3b8))();
  local_28 = CreateDeferredPrototypeAsyncGeneratorFunctionType
                       (this,(JavascriptMethod)entrypoint,(bool)(bVar3 & 1),false);
  pRVar5 = GetRecycler(this);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_50,(type_info *)&JavascriptAsyncGeneratorFunction::typeinfo,0,0xffffffffffffffff
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
             ,0x199f);
  pRVar5 = Memory::Recycler::TrackAllocInfo(pRVar5,&local_50);
  this_02 = (JavascriptAsyncGeneratorFunction *)
            new<(Memory::ObjectInfoBits)1>(0x38,pRVar5,&local_51);
  JavascriptAsyncGeneratorFunction::JavascriptAsyncGeneratorFunction
            (this_02,local_28,(GeneratorVirtualScriptFunction *)type);
  return this_02;
}

Assistant:

JavascriptAsyncGeneratorFunction* JavascriptLibrary::CreateAsyncGeneratorFunction(JavascriptMethod entryPoint, GeneratorVirtualScriptFunction* scriptFunction)
    {
        Assert(scriptContext->GetConfig()->IsES2018AsyncIterationEnabled());

        DynamicType* type = CreateDeferredPrototypeAsyncGeneratorFunctionType(entryPoint, scriptFunction->IsAnonymousFunction());

        return RecyclerNewEnumClass(this->GetRecycler(), EnumFunctionClass, JavascriptAsyncGeneratorFunction, type, scriptFunction);
    }